

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D::render
          (ASTCRenderer2D *this,Surface *referenceDst,Surface *resultDst,Texture2D *texture,
          TextureFormat *uncompressedFormat)

{
  code *pcVar1;
  int iVar2;
  int preferredHeight;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  Texture2D *pTVar7;
  undefined4 extraout_var_00;
  reference pvVar8;
  undefined4 extraout_var_01;
  PixelFormat *colorFmt;
  Texture2DView TVar9;
  PixelBufferAccess local_1d8;
  Texture2DView local_1b0;
  SurfaceAccess local_1a0;
  Vector<float,_4> local_17c;
  Sampler local_16c;
  TextureFormat local_130;
  Vector<float,_2> local_124 [2];
  Vector<float,_2> local_110;
  undefined1 local_108 [8];
  vector<float,_std::allocator<float>_> texCoord;
  ReferenceParams renderParams;
  RandomViewport viewport;
  int textureHeight;
  int textureWidth;
  RenderContext *renderCtx;
  Functions *gl;
  TextureFormat *uncompressedFormat_local;
  Texture2D *texture_local;
  Surface *resultDst_local;
  Surface *referenceDst_local;
  ASTCRenderer2D *this_local;
  long lVar6;
  
  pRVar5 = gles3::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  pRVar5 = gles3::Context::getRenderContext(this->m_context);
  pTVar7 = glu::Texture2D::getRefTexture(texture);
  iVar2 = tcu::Texture2D::getWidth(pTVar7);
  pTVar7 = glu::Texture2D::getRefTexture(texture);
  preferredHeight = tcu::Texture2D::getHeight(pTVar7);
  iVar3 = (*pRVar5->_vptr_RenderContext[4])();
  dVar4 = de::Random::getUint32(&this->m_rnd);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&renderParams.baseLevel,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar3),iVar2,preferredHeight,dVar4);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)
             ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),TEXTURETYPE_2D);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_108);
  tcu::Vector<float,_2>::Vector(&local_110,0.0,0.0);
  tcu::Vector<float,_2>::Vector(local_124,1.0,1.0);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)local_108,&local_110,local_124);
  local_130 = *uncompressedFormat;
  glu::TextureTestUtil::getSamplerType(local_130);
  tcu::Vector<float,_4>::Vector(&local_17c,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            (&local_16c,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST,NEAREST,0.0,true,
             COMPAREMODE_NONE,0,&local_17c,false,MODE_DEPTH);
  tcu::Sampler::operator=
            ((Sampler *)(renderParams.super_RenderParams.colorBias.m_data + 2),&local_16c);
  renderParams.super_RenderParams.bias = (this->m_colorScale).m_data[0];
  renderParams.super_RenderParams.ref = (this->m_colorScale).m_data[1];
  renderParams.super_RenderParams.colorScale.m_data._0_8_ =
       *(undefined8 *)((this->m_colorScale).m_data + 2);
  renderParams.super_RenderParams.colorScale.m_data[2] = (this->m_colorBias).m_data[0];
  renderParams.super_RenderParams.colorScale.m_data[3] = (this->m_colorBias).m_data[1];
  renderParams.super_RenderParams.colorBias.m_data[0] = (this->m_colorBias).m_data[2];
  renderParams.super_RenderParams.colorBias.m_data[1] = (this->m_colorBias).m_data[3];
  (**(code **)(lVar6 + 0x1a00))(renderParams.baseLevel,renderParams.maxLevel,viewport.x,viewport.y);
  (**(code **)(lVar6 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar6 + 0xb8);
  dVar4 = glu::Texture2D::getGLTexture(texture);
  (*pcVar1)(0xde1,dVar4);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2600);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fASTCDecompressionCases.cpp"
                  ,0x164);
  pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_108,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,pvVar8,
             (RenderParams *)
             ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  (**(code **)(lVar6 + 0x650))();
  iVar2 = (*pRVar5->_vptr_RenderContext[4])();
  colorFmt = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar2));
  tcu::SurfaceAccess::SurfaceAccess(&local_1a0,referenceDst,colorFmt);
  pTVar7 = glu::Texture2D::getRefTexture(texture);
  TVar9 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar7);
  local_1b0.m_levels = TVar9.m_levels;
  local_1b0.m_numLevels = TVar9.m_numLevels;
  pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_108,0);
  glu::TextureTestUtil::sampleTexture
            (&local_1a0,&local_1b0,pvVar8,
             (ReferenceParams *)
             ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  tcu::Surface::getAccess(&local_1d8,resultDst);
  glu::readPixels(pRVar5,renderParams.baseLevel,renderParams.maxLevel,&local_1d8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_108);
  return;
}

Assistant:

void ASTCRenderer2D::render (Surface& referenceDst, Surface& resultDst, const glu::Texture2D& texture, const tcu::TextureFormat& uncompressedFormat)
{
	DE_ASSERT(m_initialized);

	const glw::Functions&			gl						= m_context.getRenderContext().getFunctions();
	const glu::RenderContext&		renderCtx				= m_context.getRenderContext();
	const int						textureWidth			= texture.getRefTexture().getWidth();
	const int						textureHeight			= texture.getRefTexture().getHeight();
	const RandomViewport			viewport				(renderCtx.getRenderTarget(), textureWidth, textureHeight, m_rnd.getUint32());
	ReferenceParams					renderParams			(TEXTURETYPE_2D);
	vector<float>					texCoord;
	computeQuadTexCoord2D(texCoord, Vec2(0.0f, 0.0f), Vec2(1.0f, 1.0f));

	renderParams.samplerType	= getSamplerType(uncompressedFormat);
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= m_colorScale;
	renderParams.colorBias		= m_colorBias;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, texture.getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Issue GL draws.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	gl.flush();

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceDst, renderCtx.getRenderTarget().getPixelFormat()), texture.getRefTexture(), &texCoord[0], renderParams);

	// Read GL-rendered image.
	glu::readPixels(renderCtx, viewport.x, viewport.y, resultDst.getAccess());
}